

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O0

void __thiscall
google::protobuf::strings::GrowingArrayByteSink::Expand(GrowingArrayByteSink *this,size_t amount)

{
  unsigned_long *puVar1;
  char *__dest;
  char *bigger;
  unsigned_long local_28;
  ulong local_20;
  size_t new_capacity;
  size_t amount_local;
  GrowingArrayByteSink *this_local;
  
  local_28 = this->capacity_ + amount;
  bigger = (char *)(this->capacity_ * 3 >> 1);
  new_capacity = amount;
  amount_local = (size_t)this;
  puVar1 = std::max<unsigned_long>(&local_28,(unsigned_long *)&bigger);
  local_20 = *puVar1;
  __dest = (char *)operator_new__(local_20);
  memcpy(__dest,this->buf_,this->size_);
  if (this->buf_ != (char *)0x0) {
    operator_delete__(this->buf_);
  }
  this->buf_ = __dest;
  this->capacity_ = local_20;
  return;
}

Assistant:

void GrowingArrayByteSink::Expand(size_t amount) {  // Expand by at least 50%.
  size_t new_capacity = std::max(capacity_ + amount, (3 * capacity_) / 2);
  char* bigger = new char[new_capacity];
  memcpy(bigger, buf_, size_);
  delete[] buf_;
  buf_ = bigger;
  capacity_ = new_capacity;
}